

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tclpkcs11.c
# Opt level: O1

int tclpkcs11_setpin(ClientData cd,Tcl_Interp *interp,int objc,Tcl_Obj **objv)

{
  Tcl_Obj *pTVar1;
  Tcl_Obj *pTVar2;
  Tcl_Obj *pTVar3;
  tclpkcs11_handle *handle;
  int iVar4;
  long lVar5;
  Tcl_Obj *pTVar6;
  int *piVar7;
  CK_UTF8CHAR_PTR pCVar8;
  CK_FUNCTION_LIST_PTR_conflict pCVar9;
  CK_UTF8CHAR_PTR pCVar10;
  CK_USER_TYPE CVar11;
  CK_RV errorCode;
  char *pcVar12;
  CK_SESSION_HANDLE CVar13;
  ProcErrorProc *pPVar14;
  int oldpin_len;
  int typepin_len;
  long slotid_long;
  int newpin_len;
  int local_48;
  int local_44;
  CK_SLOT_ID local_40;
  int local_34;
  
  if (cd == (ClientData)0x0) {
    pPVar14 = tclStubsPtr->tcl_SetObjResult;
    pcVar12 = "invalid clientdata";
  }
  else if (objc == 6) {
    pTVar6 = objv[2];
    pTVar1 = objv[3];
    pTVar2 = objv[4];
    pTVar3 = objv[5];
    lVar5 = (**(code **)((long)cd + 0x40))(cd,objv[1]);
    if ((lVar5 != 0) &&
       (handle = *(tclpkcs11_handle **)(lVar5 + 0x18), handle != (tclpkcs11_handle *)0x0)) {
      iVar4 = (*tclStubsPtr->tcl_GetLongFromObj)
                        ((Tcl_Interp_conflict *)interp,pTVar6,(long *)&local_40);
      if (iVar4 != 0) {
        return iVar4;
      }
      iVar4 = tclpkcs11_start_session(handle,local_40);
      if (iVar4 == 0) {
        piVar7 = (int *)(*tclStubsPtr->tcl_GetStringFromObj)(pTVar1,&local_44);
        pCVar8 = (CK_UTF8CHAR_PTR)(*tclStubsPtr->tcl_GetStringFromObj)(pTVar2,&local_48);
        if (local_44 == 4) {
          if (*piVar7 != 0x72657375) {
LAB_001035f0:
            (*tclStubsPtr->tcl_SetObjResult)
                      ((Tcl_Interp_conflict *)interp,(Tcl_Obj *)"setpin: bad type (so or user)");
            return 1;
          }
          pCVar9 = handle->pkcs11;
          CVar13 = handle->session;
          CVar11 = 1;
        }
        else {
          if ((local_44 != 2) || ((short)*piVar7 != 0x6f73)) goto LAB_001035f0;
          pCVar9 = handle->pkcs11;
          CVar13 = handle->session;
          CVar11 = 0;
        }
        errorCode = (*pCVar9->C_Login)(CVar13,CVar11,pCVar8,(long)local_48);
        if (errorCode == 0) {
          pCVar10 = (CK_UTF8CHAR_PTR)(*tclStubsPtr->tcl_GetStringFromObj)(pTVar3,&local_34);
          errorCode = (*handle->pkcs11->C_SetPIN)
                                (handle->session,pCVar8,(long)local_48,pCVar10,(long)local_34);
          (*handle->pkcs11->C_CloseSession)(handle->session);
          pPVar14 = tclStubsPtr->tcl_SetObjResult;
          if (errorCode == 0) {
            pTVar6 = (*tclStubsPtr->tcl_NewIntObj)(1);
            (*pPVar14)((Tcl_Interp_conflict *)interp,pTVar6);
            return 0;
          }
          if (errorCode == 0xa0) {
            pTVar6 = (*tclStubsPtr->tcl_NewIntObj)(0);
            goto LAB_001036c6;
          }
        }
        else {
          if (errorCode == 0xa0) {
            pPVar14 = tclStubsPtr->tcl_SetObjResult;
            pTVar6 = (*tclStubsPtr->tcl_NewIntObj)(0);
LAB_001036c6:
            (*pPVar14)((Tcl_Interp_conflict *)interp,pTVar6);
            return 0;
          }
          pPVar14 = tclStubsPtr->tcl_SetObjResult;
        }
      }
      else {
        errorCode = (CK_RV)iVar4;
        pPVar14 = tclStubsPtr->tcl_SetObjResult;
      }
      pTVar6 = tclpkcs11_pkcs11_error(errorCode);
      goto LAB_00103579;
    }
    pPVar14 = tclStubsPtr->tcl_SetObjResult;
    pcVar12 = "invalid handle";
  }
  else {
    pPVar14 = tclStubsPtr->tcl_SetObjResult;
    pcVar12 = "wrong # args: should be \"pki::pkcs11::setpin handle slot typepin oldpin newpin\"";
  }
  pTVar6 = (*tclStubsPtr->tcl_NewStringObj)(pcVar12,-1);
LAB_00103579:
  (*pPVar14)((Tcl_Interp_conflict *)interp,pTVar6);
  return 1;
}

Assistant:

MODULE_SCOPE int tclpkcs11_setpin(ClientData cd, Tcl_Interp *interp, int objc, Tcl_Obj *CONST objv[]) {
  struct tclpkcs11_interpdata *interpdata;
  struct tclpkcs11_handle *handle;
  Tcl_HashEntry *tcl_handle_entry;
  Tcl_Obj *tcl_handle, *tcl_slotid, *tcl_oldpin, *tcl_newpin, *tcl_typepin;
  long slotid_long;
  char *oldpin;
  int oldpin_len;
  char *newpin;
  int newpin_len;
  char *typepin;
  int typepin_len;
  int tcl_rv;

  CK_SLOT_ID slotid;
  CK_RV chk_rv;
  CK_RV chk1_rv;
  CK_USER_TYPE tpin;

  if (!cd) {
    Tcl_SetObjResult(interp, Tcl_NewStringObj("invalid clientdata", -1));

    return(TCL_ERROR);
  }

  if (objc != 6) {
    Tcl_SetObjResult(interp, Tcl_NewStringObj("wrong # args: should be \"pki::pkcs11::setpin handle slot typepin oldpin newpin\"", -1));

    return(TCL_ERROR);
  }

  tcl_handle = objv[1];
  tcl_slotid = objv[2];
  tcl_typepin = objv[3];
  tcl_oldpin = objv[4];
  tcl_newpin = objv[5];

  interpdata = (struct tclpkcs11_interpdata *) cd;

  tcl_handle_entry = Tcl_FindHashEntry(&interpdata->handles, (const char *) tcl_handle);
  if (!tcl_handle_entry) {
    Tcl_SetObjResult(interp, Tcl_NewStringObj("invalid handle", -1));

    return(TCL_ERROR);
  }

  handle = (struct tclpkcs11_handle *) Tcl_GetHashValue(tcl_handle_entry);
  if (!handle) {
    Tcl_SetObjResult(interp, Tcl_NewStringObj("invalid handle", -1));

    return(TCL_ERROR);
  }

  tcl_rv = Tcl_GetLongFromObj(interp, tcl_slotid, &slotid_long);
  if (tcl_rv != TCL_OK) {
    return(tcl_rv);
  }

  slotid = slotid_long;

  chk_rv = tclpkcs11_start_session(handle, slotid);
  if (chk_rv != CKR_OK) {
    Tcl_SetObjResult(interp, tclpkcs11_pkcs11_error(chk_rv));
    return(TCL_ERROR);
  }
  typepin = Tcl_GetStringFromObj(tcl_typepin, &typepin_len);
  oldpin = Tcl_GetStringFromObj(tcl_oldpin, &oldpin_len);
  if (typepin_len == 2 && !memcmp(typepin, "so", 2)) {
    chk_rv = handle->pkcs11->C_Login(handle->session, CKU_SO, (CK_UTF8CHAR_PTR) oldpin, oldpin_len);
  } else if (typepin_len == 4 && !memcmp(typepin, "user", 4)) {
    chk_rv = handle->pkcs11->C_Login(handle->session, CKU_USER, (CK_UTF8CHAR_PTR) oldpin, oldpin_len);
  } else {
      Tcl_SetObjResult(interp, "setpin: bad type (so or user)");
      return(TCL_ERROR);
  }
  if (chk_rv != CKR_OK) {
      if (chk_rv == CKR_PIN_INCORRECT) {
          Tcl_SetObjResult(interp, Tcl_NewBooleanObj(0));
          return(TCL_OK);
      }
      Tcl_SetObjResult(interp, tclpkcs11_pkcs11_error(chk_rv));
      return(TCL_ERROR);
  }
  newpin = Tcl_GetStringFromObj(tcl_newpin, &newpin_len);
  chk1_rv = handle->pkcs11->C_SetPIN(handle->session, (CK_UTF8CHAR_PTR)oldpin, oldpin_len, (CK_UTF8CHAR_PTR)newpin, newpin_len);

  handle->pkcs11->C_CloseSession(handle->session);

  if (chk1_rv != CKR_OK) {
      if (chk1_rv == CKR_PIN_INCORRECT) {
          Tcl_SetObjResult(interp, Tcl_NewBooleanObj(0));
          return(TCL_OK);
      }
      Tcl_SetObjResult(interp, tclpkcs11_pkcs11_error(chk1_rv));
      return(TCL_ERROR);
  }

  Tcl_SetObjResult(interp, Tcl_NewBooleanObj(1));
  return(TCL_OK);
}